

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadPool.h
# Opt level: O2

void __thiscall ThreadPool<int,_8UL>::addTask(ThreadPool<int,_8UL> *this,int *value)

{
  unique_lock<std::mutex> mutexLock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->queueMutex);
  std::deque<int,_std::allocator<int>_>::push_back(&(this->tasks).c,value);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void addTask(const T& value)
    {
        std::unique_lock<std::mutex> mutexLock(queueMutex);
        tasks.push(value);
        condition.notify_one();
    }